

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_format_tar.c
# Opt level: O1

wchar_t header_pax_extensions
                  (archive_read *a,tar *tar,archive_entry *entry,void *h,size_t *unconsumed)

{
  char cVar1;
  byte bVar2;
  archive_entry *paVar3;
  wchar_t wVar4;
  int iVar5;
  wchar_t wVar6;
  char *pcVar7;
  byte *name;
  byte *pbVar8;
  long lVar9;
  dev_t dVar10;
  size_t sVar11;
  int64_t iVar12;
  archive_string_conv *sc;
  wchar_t wVar13;
  int iVar14;
  char *p;
  uint uVar15;
  archive_string *paVar16;
  size_t sVar17;
  uint uVar18;
  archive_entry *paVar19;
  uint uVar20;
  archive_string *paVar21;
  char *pcVar22;
  char *pcVar23;
  ulong uVar24;
  archive_entry *entry_00;
  char *pcVar25;
  byte *pbVar26;
  bool bVar27;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  int64_t s;
  wchar_t local_84;
  long local_78;
  time_t local_70;
  archive_string *local_68;
  archive_string *local_60;
  archive_entry *local_58;
  int64_t *local_50;
  archive_string *local_48;
  archive_string *local_40;
  wchar_t local_34;
  
  wVar4 = read_body_to_string(a,(tar *)&tar->pax_header,(archive_string *)h,unconsumed,unconsumed);
  if (wVar4 != L'\0') {
    return wVar4;
  }
  local_34 = tar_read_header(a,tar,entry,unconsumed);
  if ((local_34 != L'\0') && (local_34 != L'\xffffffec')) {
    return local_34;
  }
  pcVar22 = (tar->pax_header).s;
  pcVar23 = (char *)(tar->pax_header).length;
  tar->pax_hdrcharset_binary = 0;
  wVar4 = L'\0';
  (tar->entry_gname).length = 0;
  local_40 = &tar->entry_linkpath;
  (tar->entry_linkpath).length = 0;
  (tar->entry_pathname).length = 0;
  (tar->entry_pathname_override).length = 0;
  local_48 = &tar->entry_uname;
  (tar->entry_uname).length = 0;
  paVar16 = &tar->entry_pathname;
  paVar21 = &tar->entry_gname;
  if (pcVar23 != (char *)0x0) {
    local_50 = &tar->sparse_offset;
    wVar4 = L'\0';
    do {
      paVar19 = (archive_entry *)(pcVar22 + (long)pcVar23);
      pcVar7 = pcVar22 + (long)pcVar23 + -1;
      uVar24 = 0;
      p = pcVar23;
      pcVar25 = pcVar22;
      do {
        cVar1 = *pcVar25;
        if (cVar1 == ' ') {
          paVar19 = (archive_entry *)(pcVar25 + 1);
          pcVar7 = pcVar25;
          break;
        }
        if ((byte)(cVar1 - 0x3aU) < 0xf6) {
          pcVar22 = "Ignoring malformed pax extended attributes";
          goto LAB_003e7962;
        }
        uVar24 = (ulong)(byte)(cVar1 - 0x30) + uVar24 * 10;
        if (999999 < uVar24) {
          pcVar22 = "Rejecting pax extended attribute > 1MB";
          goto LAB_003e7962;
        }
        pcVar25 = pcVar25 + 1;
        p = p + -1;
      } while (p != (char *)0x0);
      pcVar25 = (char *)(uVar24 - 1);
      if ((pcVar23 <= pcVar25) || (pcVar22[(long)pcVar25] != '\n')) {
        pcVar22 = "Ignoring malformed pax extended attribute";
LAB_003e7962:
        archive_set_error(&a->archive,-1,pcVar22);
        wVar6 = L'\xffffffec';
        goto LAB_003e7973;
      }
      pcVar22[(long)pcVar25] = '\0';
      if (*(char *)&paVar19->archive == '=') {
        wVar6 = L'\xffffffff';
        goto LAB_003e7973;
      }
      pcVar22 = pcVar22 + uVar24;
      pcVar25 = pcVar22 + (-2 - (long)paVar19);
      paVar3 = paVar19;
      while( true ) {
        entry_00 = (archive_entry *)((long)&paVar3->archive + 1);
        if (*(char *)&paVar3->archive == '\0') {
          pcVar22 = "Invalid pax extended attributes";
          goto LAB_003e7962;
        }
        if (*(char *)&paVar3->archive == '=') break;
        pcVar25 = pcVar25 + -1;
        paVar3 = entry_00;
      }
      *(char *)&paVar3->archive = '\0';
      bVar2 = *(byte *)&paVar19->archive;
      local_68 = paVar21;
      local_60 = paVar16;
      if (bVar2 < 0x61) {
        if (bVar2 != 0x47) {
          if (bVar2 == 0x4c) {
            local_84 = L'\0';
            iVar5 = strcmp((char *)paVar19,"LIBARCHIVE.creationtime");
            if (iVar5 == 0) {
              pax_time((char *)entry_00,&local_70,&local_78);
              archive_entry_set_birthtime(entry,local_70,local_78);
            }
            auVar28[0] = -(*(char *)&paVar19->archive == 'L');
            auVar28[1] = -(*(char *)((long)&paVar19->archive + 1) == 'I');
            auVar28[2] = -(*(char *)((long)&paVar19->archive + 2) == 'B');
            auVar28[3] = -(*(char *)((long)&paVar19->archive + 3) == 'A');
            auVar28[4] = -(*(char *)((long)&paVar19->archive + 4) == 'R');
            auVar28[5] = -(*(char *)((long)&paVar19->archive + 5) == 'C');
            auVar28[6] = -(*(char *)((long)&paVar19->archive + 6) == 'H');
            auVar28[7] = -(*(char *)((long)&paVar19->archive + 7) == 'I');
            auVar28[8] = -(*(char *)&paVar19->stat == 'V');
            auVar28[9] = -(*(char *)((long)&paVar19->stat + 1) == 'E');
            auVar28[10] = -(*(char *)((long)&paVar19->stat + 2) == '.');
            auVar28[0xb] = -(*(char *)((long)&paVar19->stat + 3) == 'x');
            auVar28[0xc] = -(*(char *)((long)&paVar19->stat + 4) == 'a');
            auVar28[0xd] = -(*(char *)((long)&paVar19->stat + 5) == 't');
            auVar28[0xe] = -(*(char *)((long)&paVar19->stat + 6) == 't');
            auVar28[0xf] = -(*(char *)((long)&paVar19->stat + 7) == 'r');
            auVar30[0] = -((char)paVar19->stat_valid == '.');
            auVar30[1] = 0xff;
            auVar30[2] = 0xff;
            auVar30[3] = 0xff;
            auVar30[4] = 0xff;
            auVar30[5] = 0xff;
            auVar30[6] = 0xff;
            auVar30[7] = 0xff;
            auVar30[8] = 0xff;
            auVar30[9] = 0xff;
            auVar30[10] = 0xff;
            auVar30[0xb] = 0xff;
            auVar30[0xc] = 0xff;
            auVar30[0xd] = 0xff;
            auVar30[0xe] = 0xff;
            auVar30[0xf] = 0xff;
            auVar30 = auVar30 & auVar28;
            if (((ushort)((ushort)(SUB161(auVar30 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar30 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar30 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar30 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar30 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar30 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar30 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar30 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar30 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar30 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar30 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar30 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar30 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar30 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar30 >> 0x77,0) & 1) << 0xe |
                         (ushort)(byte)(auVar30[0xf] >> 7) << 0xf) == 0xffff) &&
               (sVar11 = strlen((char *)paVar19), 0x11 < sVar11)) {
              auVar29[0] = -(*(char *)&paVar19->archive == 'L');
              auVar29[1] = -(*(char *)((long)&paVar19->archive + 1) == 'I');
              auVar29[2] = -(*(char *)((long)&paVar19->archive + 2) == 'B');
              auVar29[3] = -(*(char *)((long)&paVar19->archive + 3) == 'A');
              auVar29[4] = -(*(char *)((long)&paVar19->archive + 4) == 'R');
              auVar29[5] = -(*(char *)((long)&paVar19->archive + 5) == 'C');
              auVar29[6] = -(*(char *)((long)&paVar19->archive + 6) == 'H');
              auVar29[7] = -(*(char *)((long)&paVar19->archive + 7) == 'I');
              auVar29[8] = -(*(char *)&paVar19->stat == 'V');
              auVar29[9] = -(*(char *)((long)&paVar19->stat + 1) == 'E');
              auVar29[10] = -(*(char *)((long)&paVar19->stat + 2) == '.');
              auVar29[0xb] = -(*(char *)((long)&paVar19->stat + 3) == 'x');
              auVar29[0xc] = -(*(char *)((long)&paVar19->stat + 4) == 'a');
              auVar29[0xd] = -(*(char *)((long)&paVar19->stat + 5) == 't');
              auVar29[0xe] = -(*(char *)((long)&paVar19->stat + 6) == 't');
              auVar29[0xf] = -(*(char *)((long)&paVar19->stat + 7) == 'r');
              auVar31[0] = -((char)paVar19->stat_valid == '.');
              auVar31[1] = 0xff;
              auVar31[2] = 0xff;
              auVar31[3] = 0xff;
              auVar31[4] = 0xff;
              auVar31[5] = 0xff;
              auVar31[6] = 0xff;
              auVar31[7] = 0xff;
              auVar31[8] = 0xff;
              auVar31[9] = 0xff;
              auVar31[10] = 0xff;
              auVar31[0xb] = 0xff;
              auVar31[0xc] = 0xff;
              auVar31[0xd] = 0xff;
              auVar31[0xe] = 0xff;
              auVar31[0xf] = 0xff;
              auVar31 = auVar31 & auVar29;
              if ((ushort)((ushort)(SUB161(auVar31 >> 7,0) & 1) |
                           (ushort)(SUB161(auVar31 >> 0xf,0) & 1) << 1 |
                           (ushort)(SUB161(auVar31 >> 0x17,0) & 1) << 2 |
                           (ushort)(SUB161(auVar31 >> 0x1f,0) & 1) << 3 |
                           (ushort)(SUB161(auVar31 >> 0x27,0) & 1) << 4 |
                           (ushort)(SUB161(auVar31 >> 0x2f,0) & 1) << 5 |
                           (ushort)(SUB161(auVar31 >> 0x37,0) & 1) << 6 |
                           (ushort)(SUB161(auVar31 >> 0x3f,0) & 1) << 7 |
                           (ushort)(SUB161(auVar31 >> 0x47,0) & 1) << 8 |
                           (ushort)(SUB161(auVar31 >> 0x4f,0) & 1) << 9 |
                           (ushort)(SUB161(auVar31 >> 0x57,0) & 1) << 10 |
                           (ushort)(SUB161(auVar31 >> 0x5f,0) & 1) << 0xb |
                           (ushort)(SUB161(auVar31 >> 0x67,0) & 1) << 0xc |
                           (ushort)(SUB161(auVar31 >> 0x6f,0) & 1) << 0xd |
                           (ushort)(SUB161(auVar31 >> 0x77,0) & 1) << 0xe |
                          (ushort)(byte)(auVar31[0xf] >> 7) << 0xf) != 0xffff)
              goto switchD_003e6ba7_caseD_62;
              pbVar26 = (byte *)(pcVar7 + 0x12);
              sVar11 = strlen((char *)pbVar26);
              name = (byte *)malloc(sVar11 + 1);
              pbVar8 = name;
              if (name == (byte *)0x0) {
                name = (byte *)0x0;
              }
              else {
                while (*pbVar26 == 0x25) {
                  iVar5 = (int)(char)pbVar26[1];
                  if ((pbVar26[1] == 0) || (iVar14 = (int)(char)pbVar26[2], pbVar26[2] == 0))
                  goto LAB_003e763a;
                  uVar18 = iVar5 - 0x30;
                  if (9 < uVar18) {
                    if (iVar5 - 0x41U < 6) {
                      uVar18 = iVar5 - 0x37;
                    }
                    else {
                      uVar18 = iVar5 - 0x57;
                      if (5 < iVar5 - 0x61U) {
                        uVar18 = 0xffffffff;
                      }
                    }
                  }
                  uVar15 = iVar14 - 0x30;
                  if (9 < uVar15) {
                    if (iVar14 - 0x41U < 6) {
                      uVar15 = iVar14 - 0x37;
                    }
                    else {
                      uVar15 = iVar14 - 0x57;
                      if (5 < iVar14 - 0x61U) {
                        uVar15 = 0xffffffff;
                      }
                    }
                  }
                  if (-1 < (int)(uVar18 | uVar15)) {
                    pbVar26 = pbVar26 + 3;
                    *pbVar8 = (byte)uVar15 | (byte)(uVar18 << 4);
                    pbVar8 = pbVar8 + 1;
                  }
                  if ((int)(uVar18 | uVar15) < 0) {
LAB_003e763a:
                    bVar2 = *pbVar26;
                    pbVar26 = pbVar26 + 1;
                    *pbVar8 = bVar2;
                    pbVar8 = pbVar8 + 1;
                  }
                }
                if (*pbVar26 != 0) goto LAB_003e763a;
                *pbVar8 = 0;
              }
              if (name != (byte *)0x0) {
                sVar11 = strlen((char *)entry_00);
                if (base64_decode_decode_table[0x42] != '\x01') {
                  base64_decode_decode_table._112_4_ = 0xffffffff;
                  base64_decode_decode_table._116_4_ = 0xffffffff;
                  base64_decode_decode_table._120_4_ = 0xffffffff;
                  base64_decode_decode_table._124_4_ = 0xffffffff;
                  base64_decode_decode_table._96_4_ = 0xffffffff;
                  base64_decode_decode_table._100_4_ = 0xffffffff;
                  base64_decode_decode_table._104_4_ = 0xffffffff;
                  base64_decode_decode_table._108_4_ = 0xffffffff;
                  base64_decode_decode_table._80_4_ = 0xffffffff;
                  base64_decode_decode_table._84_4_ = 0xffffffff;
                  base64_decode_decode_table._88_4_ = 0xffffffff;
                  base64_decode_decode_table._92_4_ = 0xffffffff;
                  base64_decode_decode_table._64_4_ = 0xffffffff;
                  base64_decode_decode_table._68_4_ = 0xffffffff;
                  base64_decode_decode_table._72_4_ = 0xffffffff;
                  base64_decode_decode_table._76_4_ = 0xffffffff;
                  base64_decode_decode_table._48_4_ = 0xffffffff;
                  base64_decode_decode_table._52_4_ = 0xffffffff;
                  base64_decode_decode_table._56_4_ = 0xffffffff;
                  base64_decode_decode_table._60_4_ = 0xffffffff;
                  base64_decode_decode_table._32_4_ = 0xffffffff;
                  base64_decode_decode_table._36_4_ = 0xffffffff;
                  base64_decode_decode_table._40_4_ = 0xffffffff;
                  base64_decode_decode_table._44_4_ = 0xffffffff;
                  base64_decode_decode_table._16_4_ = 0xffffffff;
                  base64_decode_decode_table._20_4_ = 0xffffffff;
                  base64_decode_decode_table._24_4_ = 0xffffffff;
                  base64_decode_decode_table._28_4_ = 0xffffffff;
                  base64_decode_decode_table._0_4_ = 0xffffffff;
                  base64_decode_decode_table._4_4_ = 0xffffffff;
                  base64_decode_decode_table._8_4_ = 0xffffffff;
                  base64_decode_decode_table._12_4_ = 0xffffffff;
                  lVar9 = 0;
                  do {
                    base64_decode_decode_table[(byte)(&base64_decode_digits)[lVar9]] = (char)lVar9;
                    lVar9 = lVar9 + 1;
                  } while (lVar9 != 0x40);
                }
                pbVar26 = (byte *)malloc((sVar11 - (sVar11 >> 2)) + 1);
                pbVar8 = pbVar26;
                if (pbVar26 == (byte *)0x0) {
                  sVar17 = 0;
                  pbVar26 = (byte *)0x0;
                }
                else {
                  while (sVar11 != 0) {
                    bVar27 = true;
                    uVar15 = 0;
                    paVar19 = entry_00;
                    uVar18 = 0;
                    do {
                      while( true ) {
                        entry_00 = paVar19;
                        sVar11 = sVar11 - 1;
                        bVar2 = *(byte *)&entry_00->archive;
                        if ((bVar2 == 0x3d) || (bVar2 == 0x5f)) {
                          sVar11 = 0;
                          goto LAB_003e77c0;
                        }
                        if (('\x1f' < (char)bVar2) &&
                           ((byte)base64_decode_decode_table[bVar2] != 0xff)) break;
                        entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
                        paVar19 = entry_00;
                        if (!(bool)(sVar11 != 0 & bVar27)) goto LAB_003e77c0;
                      }
                      uVar15 = uVar15 << 6 | (uint)(byte)base64_decode_decode_table[bVar2];
                      uVar20 = uVar18 + 1;
                      bVar27 = uVar18 < 3;
                      uVar18 = uVar20;
                    } while ((bVar27) &&
                            (paVar19 = (archive_entry *)((long)&entry_00->archive + 1), sVar11 != 0)
                            );
                    entry_00 = (archive_entry *)((long)&entry_00->archive + 1);
LAB_003e77c0:
                    iVar5 = uVar15 << (('\x04' - (char)uVar18) * '\x06' & 0x1fU);
                    if (uVar18 == 2) {
LAB_003e77e4:
                      *pbVar8 = (byte)((uint)iVar5 >> 0x10);
                    }
                    else {
                      if (uVar18 == 3) {
LAB_003e77e1:
                        pbVar8[1] = (byte)((uint)iVar5 >> 8);
                        goto LAB_003e77e4;
                      }
                      if (uVar18 == 4) {
                        pbVar8[2] = (byte)iVar5;
                        goto LAB_003e77e1;
                      }
                    }
                    iVar5 = uVar18 * 3 + 3;
                    if (-1 < (int)(uVar18 * 3)) {
                      iVar5 = uVar18 * 3;
                    }
                    pbVar8 = pbVar8 + (iVar5 >> 2);
                  }
                  sVar17 = (long)pbVar8 - (long)pbVar26;
                }
                if (pbVar26 != (byte *)0x0) {
                  archive_entry_xattr_add_entry(entry,(char *)name,pbVar26,sVar17);
                  free(name);
                  name = pbVar26;
                }
                free(name);
              }
            }
            goto LAB_003e732e;
          }
          local_84 = L'\0';
          if (bVar2 == 0x53) {
            iVar5 = strcmp((char *)paVar19,"SCHILY.acl.access");
            if (iVar5 == 0) {
              wVar6 = L'Ā';
            }
            else {
              iVar5 = strcmp((char *)paVar19,"SCHILY.acl.default");
              if (iVar5 == 0) {
                wVar6 = L'Ȁ';
              }
              else {
                iVar5 = strcmp((char *)paVar19,"SCHILY.acl.ace");
                if (iVar5 != 0) {
                  iVar5 = strcmp((char *)paVar19,"SCHILY.devmajor");
                  if (iVar5 == 0) {
                    sVar11 = strlen((char *)entry_00);
                    dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                    archive_entry_set_rdevmajor(entry,dVar10);
                  }
                  else {
                    iVar5 = strcmp((char *)paVar19,"SCHILY.devminor");
                    if (iVar5 == 0) {
                      sVar11 = strlen((char *)entry_00);
                      dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                      archive_entry_set_rdevminor(entry,dVar10);
                    }
                    else {
                      iVar5 = strcmp((char *)paVar19,"SCHILY.fflags");
                      if (iVar5 == 0) {
                        archive_entry_copy_fflags_text(entry,(char *)entry_00);
                      }
                      else {
                        iVar5 = strcmp((char *)paVar19,"SCHILY.dev");
                        if (iVar5 == 0) {
                          sVar11 = strlen((char *)entry_00);
                          dVar10 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                          archive_entry_set_dev(entry,dVar10);
                        }
                        else {
                          iVar5 = strcmp((char *)paVar19,"SCHILY.ino");
                          if (iVar5 == 0) {
                            sVar11 = strlen((char *)entry_00);
                            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                            archive_entry_set_ino(entry,iVar12);
                          }
                          else {
                            iVar5 = strcmp((char *)paVar19,"SCHILY.nlink");
                            if (iVar5 == 0) {
                              sVar11 = strlen((char *)entry_00);
                              iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                              archive_entry_set_nlink(entry,(uint)iVar12);
                            }
                            else {
                              local_58 = paVar19;
                              iVar5 = strcmp((char *)paVar19,"SCHILY.realsize");
                              if (iVar5 == 0) {
                                sVar11 = strlen((char *)entry_00);
                                iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
                                tar->realsize = iVar12;
                                tar->realsize_override = 1;
                                archive_entry_set_size(entry,iVar12);
                              }
                              else {
                                iVar5 = strncmp((char *)local_58,"SCHILY.xattr.",0xd);
                                if (iVar5 == 0) {
                                  pax_attribute_schily_xattr
                                            (entry,(char *)local_58,(char *)entry_00,(size_t)pcVar25
                                            );
                                }
                                else {
                                  iVar5 = strcmp((char *)local_58,"SUN.holesdata");
                                  if (iVar5 == 0) {
                                    wVar6 = solaris_sparse_parse(a,tar,entry_00,p);
                                    if (wVar6 < L'\0') {
                                      wVar13 = L'\xffffffe2';
                                      if (wVar6 == L'\xffffffe2') goto LAB_003e733d;
                                      archive_set_error(&a->archive,-1,"Parse error: SUN.holesdata")
                                      ;
                                      local_84 = wVar6;
                                    }
                                    goto switchD_003e6ba7_caseD_62;
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                  goto LAB_003e732e;
                }
                wVar6 = L'㰀';
              }
            }
            wVar6 = pax_attribute_acl(a,tar,entry,(char *)entry_00,wVar6);
            wVar13 = L'\xffffffe2';
            if (wVar6 == L'\xffffffe2') goto LAB_003e733d;
          }
          goto switchD_003e6ba7_caseD_62;
        }
        iVar5 = strncmp((char *)paVar19,"GNU.sparse",10);
        if ((iVar5 != 0) || (tar->sparse_allowed != 0)) {
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.numblocks");
          if (iVar5 == 0) {
            *(undefined4 *)local_50 = 0xffffffff;
            *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
            *(undefined4 *)(local_50 + 1) = 0xffffffff;
            *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 0;
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.offset");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_offset = iVar12;
            if (tar->sparse_numbytes != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,iVar12,tar->sparse_numbytes);
              wVar13 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_003e733d;
              *(undefined4 *)local_50 = 0xffffffff;
              *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
              *(undefined4 *)(local_50 + 1) = 0xffffffff;
              *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.numbytes");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_numbytes = iVar12;
            if (iVar12 != -1) {
              wVar6 = gnu_add_sparse_entry(a,tar,tar->sparse_offset,iVar12);
              wVar13 = L'\xffffffe2';
              if (wVar6 != L'\0') goto LAB_003e733d;
              *(undefined4 *)local_50 = 0xffffffff;
              *(undefined4 *)((long)local_50 + 4) = 0xffffffff;
              *(undefined4 *)(local_50 + 1) = 0xffffffff;
              *(undefined4 *)((long)local_50 + 0xc) = 0xffffffff;
            }
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.size");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->realsize = iVar12;
            archive_entry_set_size(entry,iVar12);
            tar->realsize_override = 1;
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.map");
          if (iVar5 == 0) {
            tar->sparse_gnu_major = 0;
            tar->sparse_gnu_minor = 1;
            wVar6 = gnu_sparse_01_parse(a,tar,(char *)entry_00);
            wVar13 = L'\xffffffec';
            if (wVar6 != L'\0') goto LAB_003e733d;
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.major");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_gnu_major = (int)iVar12;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.minor");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->sparse_gnu_minor = (int)iVar12;
            tar->sparse_gnu_pending = '\x01';
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.name");
          if (iVar5 == 0) {
            (tar->entry_pathname_override).length = 0;
            sVar11 = strlen((char *)entry_00);
            archive_strncat(&tar->entry_pathname_override,entry_00,sVar11);
          }
          iVar5 = strcmp((char *)paVar19,"GNU.sparse.realsize");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->realsize = iVar12;
            archive_entry_set_size(entry,iVar12);
            tar->realsize_override = 1;
          }
          goto LAB_003e732e;
        }
        archive_set_error(&a->archive,-1,"Non-regular file cannot be sparse");
        wVar13 = L'\xffffffe2';
      }
      else {
        local_84 = L'\0';
        switch(bVar2) {
        case 0x61:
          iVar5 = strcmp((char *)paVar19,"atime");
          if (iVar5 == 0) {
            pax_time((char *)entry_00,&local_70,&local_78);
            archive_entry_set_atime(entry,local_70,local_78);
          }
          break;
        default:
          goto switchD_003e6ba7_caseD_62;
        case 99:
          iVar5 = strcmp((char *)paVar19,"ctime");
          if (iVar5 == 0) {
            pax_time((char *)entry_00,&local_70,&local_78);
            archive_entry_set_ctime(entry,local_70,local_78);
          }
          break;
        case 0x67:
          iVar5 = strcmp((char *)paVar19,"gid");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            archive_entry_set_gid(entry,iVar12);
          }
          else {
            iVar5 = strcmp((char *)paVar19,"gname");
            if (iVar5 == 0) {
              (tar->entry_gname).length = 0;
              sVar17 = strlen((char *)entry_00);
              paVar16 = local_68;
LAB_003e6f31:
              archive_strncat(paVar16,entry_00,sVar17);
            }
          }
          break;
        case 0x68:
          iVar5 = strcmp((char *)paVar19,"hdrcharset");
          if (iVar5 == 0) {
            iVar5 = strcmp((char *)entry_00,"BINARY");
            if (iVar5 == 0) {
              tar->pax_hdrcharset_binary = 1;
            }
            else {
              iVar5 = strcmp((char *)entry_00,"ISO-IR 10646 2000 UTF-8");
              if (iVar5 == 0) {
                tar->pax_hdrcharset_binary = 0;
              }
            }
          }
          break;
        case 0x6c:
          iVar5 = strcmp((char *)paVar19,"linkpath");
          if (iVar5 == 0) {
            (tar->entry_linkpath).length = 0;
            sVar17 = strlen((char *)entry_00);
            paVar16 = local_40;
LAB_003e6ffe:
            archive_strncat(paVar16,entry_00,sVar17);
          }
          break;
        case 0x6d:
          iVar5 = strcmp((char *)paVar19,"mtime");
          if (iVar5 == 0) {
            pax_time((char *)entry_00,&local_70,&local_78);
            archive_entry_set_mtime(entry,local_70,local_78);
          }
          break;
        case 0x70:
          iVar5 = strcmp((char *)paVar19,"path");
          if (iVar5 == 0) {
            (tar->entry_pathname).length = 0;
            sVar17 = strlen((char *)entry_00);
            paVar16 = local_60;
            goto LAB_003e6ffe;
          }
          break;
        case 0x73:
          iVar5 = strcmp((char *)paVar19,"size");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            tar->entry_bytes_remaining = iVar12;
            if (tar->realsize_override == 0) {
              archive_entry_set_size(entry,iVar12);
              tar->realsize = tar->entry_bytes_remaining;
            }
          }
          break;
        case 0x75:
          iVar5 = strcmp((char *)paVar19,"uid");
          if (iVar5 == 0) {
            sVar11 = strlen((char *)entry_00);
            iVar12 = tar_atol_base_n((char *)entry_00,sVar11,L'\n');
            archive_entry_set_uid(entry,iVar12);
          }
          else {
            iVar5 = strcmp((char *)paVar19,"uname");
            if (iVar5 == 0) {
              (tar->entry_uname).length = 0;
              sVar17 = strlen((char *)entry_00);
              paVar16 = local_48;
              goto LAB_003e6f31;
            }
          }
        }
LAB_003e732e:
        local_84 = L'\0';
switchD_003e6ba7_caseD_62:
        wVar13 = local_84;
      }
LAB_003e733d:
      if (wVar13 == L'\xffffffe2') goto LAB_003e7b99;
      if (wVar13 <= wVar4) {
        wVar4 = wVar13;
      }
      pcVar23 = pcVar23 + -uVar24;
      paVar16 = local_60;
      paVar21 = local_68;
    } while (pcVar23 != (char *)0x0);
  }
  local_68 = paVar21;
  local_60 = paVar16;
  if (tar->pax_hdrcharset_binary == 0) {
    sc = archive_string_conversion_from_charset(&a->archive,"UTF-8",L'\x01');
    if (sc == (archive_string_conv *)0x0) {
LAB_003e7b99:
      wVar6 = L'\xffffffe2';
      goto LAB_003e7973;
    }
    if (tar->compat_2x != 0) {
      archive_string_conversion_set_opt(sc,L'\x01');
    }
  }
  else {
    sc = tar->opt_sconv;
  }
  sVar17 = (tar->entry_gname).length;
  if ((sVar17 != 0) &&
     (wVar6 = _archive_entry_copy_gname_l(entry,local_68->s,sVar17,sc), wVar6 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Gname");
    wVar6 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_003e7973;
    archive_entry_copy_gname(entry,local_68->s);
  }
  sVar17 = (tar->entry_linkpath).length;
  if ((sVar17 != 0) &&
     (wVar6 = _archive_entry_copy_link_l(entry,local_40->s,sVar17,sc), wVar6 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Linkname");
    wVar6 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_003e7973;
    archive_entry_copy_link(entry,local_40->s);
  }
  paVar16 = &tar->entry_pathname_override;
  if (((tar->entry_pathname_override).length == 0) &&
     (paVar16 = local_60, (tar->entry_pathname).length == 0)) {
    paVar16 = (archive_string *)0x0;
  }
  wVar6 = wVar4;
  if ((paVar16 != (archive_string *)0x0) &&
     (wVar4 = _archive_entry_copy_pathname_l(entry,paVar16->s,paVar16->length,sc), wVar4 != L'\0'))
  {
    wVar4 = set_conversion_failed_error(a,sc,"Pathname");
    wVar6 = L'\xffffffe2';
    if (wVar4 == L'\xffffffe2') goto LAB_003e7973;
    archive_entry_copy_pathname(entry,paVar16->s);
    wVar6 = wVar4;
  }
  sVar17 = (tar->entry_uname).length;
  if ((sVar17 != 0) &&
     (wVar4 = _archive_entry_copy_uname_l(entry,local_48->s,sVar17,sc), wVar4 != L'\0')) {
    wVar4 = set_conversion_failed_error(a,sc,"Uname");
    wVar6 = L'\xffffffe2';
    if (wVar4 != L'\xffffffe2') {
      archive_entry_copy_uname(entry,local_48->s);
      wVar6 = wVar4;
    }
  }
LAB_003e7973:
  if (local_34 < wVar6) {
    wVar6 = local_34;
  }
  tar->entry_padding = (ulong)(-(int)tar->entry_bytes_remaining & 0x1ff);
  return wVar6;
}

Assistant:

static int
header_pax_extensions(struct archive_read *a, struct tar *tar,
    struct archive_entry *entry, const void *h, size_t *unconsumed)
{
	int err, err2;

	err = read_body_to_string(a, tar, &(tar->pax_header), h, unconsumed);
	if (err != ARCHIVE_OK)
		return (err);

	/* Parse the next header. */
	err = tar_read_header(a, tar, entry, unconsumed);
	if ((err != ARCHIVE_OK) && (err != ARCHIVE_WARN))
		return (err);

	/*
	 * TODO: Parse global/default options into 'entry' struct here
	 * before handling file-specific options.
	 *
	 * This design (parse standard header, then overwrite with pax
	 * extended attribute data) usually works well, but isn't ideal;
	 * it would be better to parse the pax extended attributes first
	 * and then skip any fields in the standard header that were
	 * defined in the pax header.
	 */
	err2 = pax_header(a, tar, entry, &tar->pax_header);
	err =  err_combine(err, err2);
	tar->entry_padding = 0x1ff & (-tar->entry_bytes_remaining);
	return (err);
}